

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O0

void __thiscall bal::GraphMLStreamWriter::write_variables(GraphMLStreamWriter *this,Cnf *value)

{
  _func_int *p_Var1;
  long lVar2;
  GraphMLStreamWriter *pGVar3;
  bool *__first;
  int index;
  string *psVar4;
  const_iterator this_00;
  Cnf *this_01;
  bool bVar5;
  uint uVar6;
  variableid_t vVar7;
  uint uVar8;
  _Base_ptr this_02;
  pointer ppVar9;
  literalid_t *plVar10;
  char *name;
  bool *__last;
  undefined8 uStack_90;
  uint local_88;
  variableid_t local_84;
  bool local_7d;
  uint local_7c;
  GraphMLStreamWriter *local_78;
  bool *local_70;
  uint local_64;
  uint local_60;
  int i_1;
  variableid_t variable_id;
  int i;
  string *nv_name;
  VariablesArray *nv_variables;
  _Self local_40;
  const_iterator it;
  formula_named_variables_t *nv;
  ulong local_28;
  unsigned_long __vla_expr0;
  Cnf *local_18;
  Cnf *value_local;
  GraphMLStreamWriter *this_local;
  
  uStack_90 = 0x121058;
  local_78 = this;
  local_18 = value;
  value_local = (Cnf *)this;
  uVar6 = (*(value->super_Formula)._vptr_Formula[1])();
  local_28 = (ulong)uVar6;
  lVar2 = -(local_28 + 0xf & 0xfffffffffffffff0);
  local_70 = (bool *)((long)&local_88 + lVar2);
  p_Var1 = (local_18->super_Formula)._vptr_Formula[1];
  __vla_expr0 = (unsigned_long)&local_88;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121087;
  uVar6 = (*p_Var1)();
  __first = local_70;
  __last = local_70 + uVar6;
  nv._7_1_ = 0;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210a0;
  std::fill<bool*,bool>(__first,__last,(bool *)((long)&nv + 7));
  this_01 = local_18;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210a9;
  this_02 = (_Base_ptr)Formula::get_named_variables_abi_cxx11_(&this_01->super_Formula);
  it._M_node = this_02;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210b6;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
       ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
                *)this_02);
  while( true ) {
    this_00._M_node = it._M_node;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210c3;
    nv_variables = (VariablesArray *)
                   std::
                   map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
                   ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
                          *)this_00._M_node);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210d4;
    bVar5 = std::operator!=(&local_40,(_Self *)&nv_variables);
    if (!bVar5) break;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210e6;
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
             ::operator->(&local_40);
    nv_name = (string *)&ppVar9->second;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1210f7;
    _variable_id = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
                   ::operator->(&local_40);
    i_1 = 0;
    while( true ) {
      psVar4 = nv_name;
      local_7c = i_1;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121111;
      vVar7 = VariablesArray::size((VariablesArray *)psVar4);
      psVar4 = nv_name;
      if (vVar7 <= local_7c) break;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121127;
      plVar10 = VariablesArray::data((VariablesArray *)psVar4);
      psVar4 = nv_name;
      local_7d = false;
      if (1 < plVar10[i_1]) {
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121142;
        plVar10 = VariablesArray::data((VariablesArray *)psVar4);
        local_7d = plVar10[i_1] != 0xffffffff;
      }
      psVar4 = nv_name;
      if (local_7d != false) {
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121162;
        plVar10 = VariablesArray::data((VariablesArray *)psVar4);
        local_60 = (plVar10[i_1] >> 1) - 1;
        if ((local_70[local_60] & 1U) == 0) {
          local_84 = local_60;
          *(undefined8 *)((long)&uStack_90 + lVar2) = 0x121190;
          name = (char *)std::__cxx11::string::c_str();
          index = i_1;
          pGVar3 = local_78;
          vVar7 = local_84;
          *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1211a2;
          write_variable(pGVar3,vVar7,name,index);
          local_70[local_60] = true;
        }
      }
      i_1 = i_1 + 1;
    }
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1211ca;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
    ::operator++(&local_40);
  }
  local_64 = 0;
  while( true ) {
    local_88 = local_64;
    p_Var1 = (local_18->super_Formula)._vptr_Formula[1];
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x1211e6;
    uVar8 = (*p_Var1)();
    uVar6 = local_64;
    pGVar3 = local_78;
    if (uVar8 <= local_88) break;
    if ((local_70[(int)local_64] & 1U) == 0) {
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x12120f;
      write_variable(pGVar3,uVar6,(char *)0x0,0);
      local_70[(int)local_64] = true;
    }
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

void write_variables(const Cnf& value) {
            bool is_processed[value.variables_size()];
            std::fill(is_processed, is_processed + value.variables_size(), false);
            
            const formula_named_variables_t& nv = value.get_named_variables();
            for (formula_named_variables_t::const_iterator it = nv.begin(); it != nv.end(); ++it) {
                const VariablesArray& nv_variables = it->second;
                const std::string& nv_name = it->first;
                for (auto i = 0; i < nv_variables.size(); i++) {
                    if (literal_t__is_variable(nv_variables.data()[i])) {
                        const variableid_t variable_id = literal_t__variable_id(nv_variables.data()[i]);
                        if (!is_processed[variable_id]) {
                            write_variable(variable_id, nv_name.c_str(), i);
                            is_processed[variable_id] = true;
                        };
                    };
                };
            };
            
            for (auto i = 0; i < value.variables_size(); i++) {
                if (!is_processed[i]) {
                    write_variable(i);
                    is_processed[i] = true;
                };
            };
        }